

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_test.c
# Opt level: O0

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  int iVar96;
  int iVar97;
  int iVar98;
  int iVar99;
  int iVar100;
  int iVar101;
  int iVar102;
  int iVar103;
  int iVar104;
  int iVar105;
  int iVar106;
  int iVar107;
  int iVar108;
  int iVar109;
  int iVar110;
  int iVar111;
  int iVar112;
  int iVar113;
  int iVar114;
  int iVar115;
  int iVar116;
  int iVar117;
  int iVar118;
  int iVar119;
  int iVar120;
  int iVar121;
  int iVar122;
  int iVar123;
  int iVar124;
  int iVar125;
  int iVar126;
  int iVar127;
  int iVar128;
  int iVar129;
  int iVar130;
  int iVar131;
  int iVar132;
  int iVar133;
  int iVar134;
  int iVar135;
  int iVar136;
  int iVar137;
  int iVar138;
  int iVar139;
  int iVar140;
  int iVar141;
  int iVar142;
  int iVar143;
  int iVar144;
  int iVar145;
  int iVar146;
  int iVar147;
  int iVar148;
  int iVar149;
  int iVar150;
  int iVar151;
  int iVar152;
  int iVar153;
  int iVar154;
  int iVar155;
  int iVar156;
  int iVar157;
  int iVar158;
  int iVar159;
  int iVar160;
  int iVar161;
  int iVar162;
  int iVar163;
  int iVar164;
  int iVar165;
  int iVar166;
  int iVar167;
  int iVar168;
  int iVar169;
  int iVar170;
  int iVar171;
  int iVar172;
  int iVar173;
  int iVar174;
  int iVar175;
  int iVar176;
  int iVar177;
  int iVar178;
  int iVar179;
  int iVar180;
  int iVar181;
  int iVar182;
  int iVar183;
  int iVar184;
  int iVar185;
  int iVar186;
  int iVar187;
  int iVar188;
  int iVar189;
  int iVar190;
  int iVar191;
  int iVar192;
  int iVar193;
  int iVar194;
  int iVar195;
  int iVar196;
  int iVar197;
  int iVar198;
  int iVar199;
  int iVar200;
  int iVar201;
  int iVar202;
  int iVar203;
  int iVar204;
  int iVar205;
  int iVar206;
  int iVar207;
  int iVar208;
  int iVar209;
  int iVar210;
  int iVar211;
  int iVar212;
  int iVar213;
  int iVar214;
  int iVar215;
  int iVar216;
  int iVar217;
  int iVar218;
  int iVar219;
  int iVar220;
  int iVar221;
  int iVar222;
  int iVar223;
  int iVar224;
  int iVar225;
  int iVar226;
  int iVar227;
  uint uVar228;
  uint local_c;
  int errors;
  
  fprintf(_stderr,"Test group: equality\n");
  iVar1 = version_test_symmetrical("0","0",0);
  iVar2 = version_test_symmetrical("0a","0a",0);
  iVar3 = version_test_symmetrical("a","a",0);
  iVar4 = version_test_symmetrical("a0","a0",0);
  iVar5 = version_test_symmetrical("0a1","0a1",0);
  iVar6 = version_test_symmetrical("0a1b2","0a1b2",0);
  iVar7 = version_test_symmetrical("1alpha1","1alpha1",0);
  iVar8 = version_test_symmetrical("foo","foo",0);
  iVar9 = version_test_symmetrical("1.2.3","1.2.3",0);
  iVar10 = version_test_symmetrical("hello.world","hello.world",0);
  fprintf(_stderr,"\nTest group: different number of components\n");
  iVar11 = version_test_symmetrical("1","1.0",0);
  iVar12 = version_test_symmetrical("1","1.0.0",0);
  iVar13 = version_test_symmetrical("1.0","1.0.0",0);
  iVar14 = version_test_symmetrical("1.0","1.0.0.0.0.0.0.0",0);
  fprintf(_stderr,"\nTest group: leading zeroes\n");
  iVar15 = version_test_symmetrical("00100.00100","100.100",0);
  iVar16 = version_test_symmetrical("0","00000000000000000",0);
  fprintf(_stderr,"\nTest group: simple comparisons\n");
  iVar17 = version_test_symmetrical("0.0.0","0.0.1",-1);
  iVar18 = version_test_symmetrical("0.0.1","0.0.2",-1);
  iVar19 = version_test_symmetrical("0.0.2","0.0.10",-1);
  iVar20 = version_test_symmetrical("0.0.2","0.1.0",-1);
  iVar21 = version_test_symmetrical("0.0.10","0.1.0",-1);
  iVar22 = version_test_symmetrical("0.1.0","0.1.1",-1);
  iVar23 = version_test_symmetrical("0.1.1","1.0.0",-1);
  iVar24 = version_test_symmetrical("1.0.0","10.0.0",-1);
  iVar25 = version_test_symmetrical("10.0.0","100.0.0",-1);
  iVar26 = version_test_symmetrical("10.10000.10000","11.0.0",-1);
  fprintf(_stderr,"\nTest group: long numbers\n");
  iVar27 = version_test_symmetrical("20160101","20160102",-1);
  iVar28 = version_test_symmetrical("999999999999999999","1000000000000000000",-1);
  fprintf(_stderr,"\nTest group: very long numbers\n");
  iVar29 = version_test_symmetrical
                     ("99999999999999999999999999999999999998",
                      "99999999999999999999999999999999999999",-1);
  fprintf(_stderr,"\nTest group: letter addendum\n");
  iVar30 = version_test_symmetrical("1.0","1.0a",-1);
  iVar31 = version_test_symmetrical("1.0a","1.0b",-1);
  iVar32 = version_test_symmetrical("1.0b","1.1",-1);
  fprintf(_stderr,"\nTest group: letter vs. number\n");
  iVar33 = version_test_symmetrical("a","0",-1);
  iVar34 = version_test_symmetrical("1.a","1.0",-1);
  fprintf(_stderr,"\nTest group: letter-only component\n");
  iVar35 = version_test_symmetrical("1.0.a","1.0.b",-1);
  iVar36 = version_test_symmetrical("1.0.b","1.0.c",-1);
  iVar37 = version_test_symmetrical("1.0.c","1.0",-1);
  iVar38 = version_test_symmetrical("1.0.c","1.0.0",-1);
  fprintf(_stderr,"\nTest group: letter component split\n");
  iVar39 = version_test_symmetrical("1.0a0","1.0.a0",0);
  iVar40 = version_test_symmetrical("1.0beta3","1.0.b3",0);
  fprintf(_stderr,"\nTest group: case is ignored\n");
  iVar41 = version_test_symmetrical("a","A",0);
  iVar42 = version_test_symmetrical("1alpha","1ALPHA",0);
  iVar43 = version_test_symmetrical("alpha1","ALPHA1",0);
  fprintf(_stderr,"\nTest group: strings are shortened to one letter\n");
  iVar44 = version_test_symmetrical("a","alpha",0);
  iVar45 = version_test_symmetrical("b","beta",0);
  iVar46 = version_test_symmetrical("p","prerelease",0);
  fprintf(_stderr,"\nTest group: unusial component separators\n");
  iVar47 = version_test_symmetrical("1.0.alpha.2","1_0_alpha_2",0);
  iVar48 = version_test_symmetrical("1.0.alpha.2","1-0-alpha-2",0);
  iVar49 = version_test_symmetrical("1.0.alpha.2","1,0:alpha~2",0);
  fprintf(_stderr,"\nTest group: multiple consequentional separators\n");
  iVar50 = version_test_symmetrical("..1....2....3..","1.2.3",0);
  iVar51 = version_test_symmetrical(".-~1~-.-~2~-.","1.2",0);
  iVar52 = version_test_symmetrical(".,:;~+-_","0",0);
  fprintf(_stderr,"\nTest group: empty string\n");
  iVar53 = version_test_symmetrical("","",0);
  iVar54 = version_test_symmetrical("","0",0);
  iVar55 = version_test_symmetrical("","1",-1);
  fprintf(_stderr,"\nTest group: prerelease sequence\n");
  iVar56 = version_test_symmetrical("1.0alpha1","1.0alpha2",-1);
  iVar57 = version_test_symmetrical("1.0alpha2","1.0beta1",-1);
  iVar58 = version_test_symmetrical("1.0beta1","1.0beta2",-1);
  iVar59 = version_test_symmetrical("1.0beta2","1.0rc1",-1);
  iVar60 = version_test_symmetrical("1.0beta2","1.0pre1",-1);
  iVar61 = version_test_symmetrical("1.0rc1","1.0",-1);
  iVar62 = version_test_symmetrical("1.0pre1","1.0",-1);
  iVar63 = version_test_symmetrical("1.0.alpha1","1.0.alpha2",-1);
  iVar64 = version_test_symmetrical("1.0.alpha2","1.0.beta1",-1);
  iVar65 = version_test_symmetrical("1.0.beta1","1.0.beta2",-1);
  iVar66 = version_test_symmetrical("1.0.beta2","1.0.rc1",-1);
  iVar67 = version_test_symmetrical("1.0.beta2","1.0.pre1",-1);
  iVar68 = version_test_symmetrical("1.0.rc1","1.0",-1);
  iVar69 = version_test_symmetrical("1.0.pre1","1.0",-1);
  iVar70 = version_test_symmetrical("1.0alpha.1","1.0alpha.2",-1);
  iVar71 = version_test_symmetrical("1.0alpha.2","1.0beta.1",-1);
  iVar72 = version_test_symmetrical("1.0beta.1","1.0beta.2",-1);
  iVar73 = version_test_symmetrical("1.0beta.2","1.0rc.1",-1);
  iVar74 = version_test_symmetrical("1.0beta.2","1.0pre.1",-1);
  iVar75 = version_test_symmetrical("1.0rc.1","1.0",-1);
  iVar76 = version_test_symmetrical("1.0pre.1","1.0",-1);
  iVar77 = version_test_symmetrical("1.0.alpha.1","1.0.alpha.2",-1);
  iVar78 = version_test_symmetrical("1.0.alpha.2","1.0.beta.1",-1);
  iVar79 = version_test_symmetrical("1.0.beta.1","1.0.beta.2",-1);
  iVar80 = version_test_symmetrical("1.0.beta.2","1.0.rc.1",-1);
  iVar81 = version_test_symmetrical("1.0.beta.2","1.0.pre.1",-1);
  iVar82 = version_test_symmetrical("1.0.rc.1","1.0",-1);
  iVar83 = version_test_symmetrical("1.0.pre.1","1.0",-1);
  fprintf(_stderr,"\nTest group: long word awareness\n");
  iVar84 = version_test_symmetrical("1.0alpha-1","0.9",1);
  iVar85 = version_test_symmetrical("1.0alpha-1","1.0",-1);
  iVar86 = version_test_symmetrical("1.0alpha-1","1.0.1",-1);
  iVar87 = version_test_symmetrical("1.0alpha-1","1.1",-1);
  iVar88 = version_test_symmetrical("1.0beta-1","0.9",1);
  iVar89 = version_test_symmetrical("1.0beta-1","1.0",-1);
  iVar90 = version_test_symmetrical("1.0beta-1","1.0.1",-1);
  iVar91 = version_test_symmetrical("1.0beta-1","1.1",-1);
  iVar92 = version_test_symmetrical("1.0pre-1","0.9",1);
  iVar93 = version_test_symmetrical("1.0pre-1","1.0",-1);
  iVar94 = version_test_symmetrical("1.0pre-1","1.0.1",-1);
  iVar95 = version_test_symmetrical("1.0pre-1","1.1",-1);
  iVar96 = version_test_symmetrical("1.0prerelease-1","0.9",1);
  iVar97 = version_test_symmetrical("1.0prerelease-1","1.0",-1);
  iVar98 = version_test_symmetrical("1.0prerelease-1","1.0.1",-1);
  iVar99 = version_test_symmetrical("1.0prerelease-1","1.1",-1);
  iVar100 = version_test_symmetrical("1.0rc-1","0.9",1);
  iVar101 = version_test_symmetrical("1.0rc-1","1.0",-1);
  iVar102 = version_test_symmetrical("1.0rc-1","1.0.1",-1);
  iVar103 = version_test_symmetrical("1.0rc-1","1.1",-1);
  fprintf(_stderr,"\nTest group: post-release keyword awareness\n");
  iVar104 = version_test_symmetrical("1.0patch1","0.9",1);
  iVar105 = version_test_symmetrical("1.0patch1","1.0",1);
  iVar106 = version_test_symmetrical("1.0patch1","1.0.1",-1);
  iVar107 = version_test_symmetrical("1.0patch1","1.1",-1);
  iVar108 = version_test_symmetrical("1.0.patch1","0.9",1);
  iVar109 = version_test_symmetrical("1.0.patch1","1.0",1);
  iVar110 = version_test_symmetrical("1.0.patch1","1.0.1",-1);
  iVar111 = version_test_symmetrical("1.0.patch1","1.1",-1);
  iVar112 = version_test_symmetrical("1.0patch.1","0.9",1);
  iVar113 = version_test_symmetrical("1.0patch.1","1.0",1);
  iVar114 = version_test_symmetrical("1.0patch.1","1.0.1",-1);
  iVar115 = version_test_symmetrical("1.0patch.1","1.1",-1);
  iVar116 = version_test_symmetrical("1.0.patch.1","0.9",1);
  iVar117 = version_test_symmetrical("1.0.patch.1","1.0",1);
  iVar118 = version_test_symmetrical("1.0.patch.1","1.0.1",-1);
  iVar119 = version_test_symmetrical("1.0.patch.1","1.1",-1);
  iVar120 = version_test_symmetrical("1.0post1","0.9",1);
  iVar121 = version_test_symmetrical("1.0post1","1.0",1);
  iVar122 = version_test_symmetrical("1.0post1","1.0.1",-1);
  iVar123 = version_test_symmetrical("1.0post1","1.1",-1);
  iVar124 = version_test_symmetrical("1.0postanythinggoeshere1","0.9",1);
  iVar125 = version_test_symmetrical("1.0postanythinggoeshere1","1.0",1);
  iVar126 = version_test_symmetrical("1.0postanythinggoeshere1","1.0.1",-1);
  iVar127 = version_test_symmetrical("1.0postanythinggoeshere1","1.1",-1);
  iVar128 = version_test_symmetrical("1.0pl1","0.9",1);
  iVar129 = version_test_symmetrical("1.0pl1","1.0",1);
  iVar130 = version_test_symmetrical("1.0pl1","1.0.1",-1);
  iVar131 = version_test_symmetrical("1.0pl1","1.1",-1);
  iVar132 = version_test_symmetrical("1.0errata1","0.9",1);
  iVar133 = version_test_symmetrical("1.0errata1","1.0",1);
  iVar134 = version_test_symmetrical("1.0errata1","1.0.1",-1);
  iVar135 = version_test_symmetrical("1.0errata1","1.1",-1);
  fprintf(_stderr,"\nTest group: p is patch flag\n");
  iVar136 = version_test_symmetrical_flags("1.0p1","1.0p1",0,0,0);
  iVar137 = version_test_symmetrical_flags("1.0p1","1.0p1",1,1,0);
  iVar138 = version_test_symmetrical_flags("1.0p1","1.0p1",1,0,1);
  iVar139 = version_test_symmetrical_flags("1.0p1","1.0p1",0,1,-1);
  iVar140 = version_test_symmetrical_flags("1.0p1","1.0P1",0,0,0);
  iVar141 = version_test_symmetrical_flags("1.0p1","1.0P1",1,1,0);
  iVar142 = version_test_symmetrical_flags("1.0","1.0p1",0,0,1);
  iVar143 = version_test_symmetrical_flags("1.0","1.0p1",1,0,1);
  iVar144 = version_test_symmetrical_flags("1.0","1.0p1",0,1,-1);
  iVar145 = version_test_symmetrical_flags("1.0","1.0.p1",0,0,1);
  iVar146 = version_test_symmetrical_flags("1.0","1.0.p1",1,0,1);
  iVar147 = version_test_symmetrical_flags("1.0","1.0.p1",0,1,-1);
  iVar148 = version_test_symmetrical_flags("1.0","1.0.p.1",0,0,1);
  iVar149 = version_test_symmetrical_flags("1.0","1.0.p.1",1,0,1);
  iVar150 = version_test_symmetrical_flags("1.0","1.0.p.1",0,1,-1);
  iVar151 = version_test_symmetrical_flags("1.0","1.0p.1",0,0,-1);
  iVar152 = version_test_symmetrical_flags("1.0","1.0p.1",1,0,-1);
  iVar153 = version_test_symmetrical_flags("1.0","1.0p.1",0,1,-1);
  fprintf(_stderr,"\nTest group: any is patch flag\n");
  iVar154 = version_test_symmetrical_flags("1.0a1","1.0a1",0,0,0);
  iVar155 = version_test_symmetrical_flags("1.0a1","1.0a1",2,2,0);
  iVar156 = version_test_symmetrical_flags("1.0a1","1.0a1",2,0,1);
  iVar157 = version_test_symmetrical_flags("1.0a1","1.0a1",0,2,-1);
  iVar158 = version_test_symmetrical_flags("1.0","1.0a1",0,0,1);
  iVar159 = version_test_symmetrical_flags("1.0","1.0a1",2,0,1);
  iVar160 = version_test_symmetrical_flags("1.0","1.0a1",0,2,-1);
  iVar161 = version_test_symmetrical_flags("1.0","1.0.a1",0,0,1);
  iVar162 = version_test_symmetrical_flags("1.0","1.0.a1",2,0,1);
  iVar163 = version_test_symmetrical_flags("1.0","1.0.a1",0,2,-1);
  iVar164 = version_test_symmetrical_flags("1.0","1.0.a.1",0,0,1);
  iVar165 = version_test_symmetrical_flags("1.0","1.0.a.1",2,0,1);
  iVar166 = version_test_symmetrical_flags("1.0","1.0.a.1",0,2,-1);
  iVar167 = version_test_symmetrical_flags("1.0","1.0a.1",0,0,-1);
  iVar168 = version_test_symmetrical_flags("1.0","1.0a.1",2,0,-1);
  iVar169 = version_test_symmetrical_flags("1.0","1.0a.1",0,2,-1);
  fprintf(_stderr,"\nTest group: p/patch compatibility\n");
  iVar170 = version_test_symmetrical_flags("1.0p1","1.0pre1",0,0,0);
  iVar171 = version_test_symmetrical_flags("1.0p1","1.0patch1",0,0,-1);
  iVar172 = version_test_symmetrical_flags("1.0p1","1.0post1",0,0,-1);
  iVar173 = version_test_symmetrical_flags("1.0p1","1.0pre1",1,1,1);
  iVar174 = version_test_symmetrical_flags("1.0p1","1.0patch1",1,1,0);
  iVar175 = version_test_symmetrical_flags("1.0p1","1.0post1",1,1,0);
  fprintf(_stderr,"\nTest group: prerelease words without numbers\n");
  iVar176 = version_test_symmetrical("1.0alpha","1.0",-1);
  iVar177 = version_test_symmetrical("1.0.alpha","1.0",-1);
  iVar178 = version_test_symmetrical("1.0beta","1.0",-1);
  iVar179 = version_test_symmetrical("1.0.beta","1.0",-1);
  iVar180 = version_test_symmetrical("1.0rc","1.0",-1);
  iVar181 = version_test_symmetrical("1.0.rc","1.0",-1);
  iVar182 = version_test_symmetrical("1.0pre","1.0",-1);
  iVar183 = version_test_symmetrical("1.0.pre","1.0",-1);
  iVar184 = version_test_symmetrical("1.0prerelese","1.0",-1);
  iVar185 = version_test_symmetrical("1.0.prerelese","1.0",-1);
  iVar186 = version_test_symmetrical("1.0patch","1.0",1);
  iVar187 = version_test_symmetrical("1.0.patch","1.0",1);
  fprintf(_stderr,"\nTest group: release bounds\n");
  iVar188 = version_test_symmetrical_flags("0.99999","1.0",0,0,-1);
  iVar189 = version_test_symmetrical_flags("1.0alpha","1.0",0,0,-1);
  iVar190 = version_test_symmetrical_flags("1.0alpha0","1.0",0,0,-1);
  iVar191 = version_test_symmetrical_flags("1.0","1.0",0,0,0);
  iVar192 = version_test_symmetrical_flags("1.0patch","1.0",0,0,1);
  iVar193 = version_test_symmetrical_flags("1.0patch0","1.0",0,0,1);
  iVar194 = version_test_symmetrical_flags("1.0.1","1.0",0,0,1);
  iVar195 = version_test_symmetrical_flags("1.1","1.0",0,0,1);
  iVar196 = version_test_symmetrical_flags("0.99999","1.0",0,4,-1);
  iVar197 = version_test_symmetrical_flags("1.0alpha","1.0",0,4,1);
  iVar198 = version_test_symmetrical_flags("1.0alpha0","1.0",0,4,1);
  iVar199 = version_test_symmetrical_flags("1.0","1.0",0,4,1);
  iVar200 = version_test_symmetrical_flags("1.0patch","1.0",0,4,1);
  iVar201 = version_test_symmetrical_flags("1.0patch0","1.0",0,4,1);
  iVar202 = version_test_symmetrical_flags("1.0a","1.0",0,4,1);
  iVar203 = version_test_symmetrical_flags("1.0.1","1.0",0,4,1);
  iVar204 = version_test_symmetrical_flags("1.1","1.0",0,4,1);
  iVar205 = version_test_symmetrical_flags("0.99999","1.0",0,8,-1);
  iVar206 = version_test_symmetrical_flags("1.0alpha","1.0",0,8,-1);
  iVar207 = version_test_symmetrical_flags("1.0alpha0","1.0",0,8,-1);
  iVar208 = version_test_symmetrical_flags("1.0","1.0",0,8,-1);
  iVar209 = version_test_symmetrical_flags("1.0patch","1.0",0,8,-1);
  iVar210 = version_test_symmetrical_flags("1.0patch0","1.0",0,8,-1);
  iVar211 = version_test_symmetrical_flags("1.0a","1.0",0,8,-1);
  iVar212 = version_test_symmetrical_flags("1.0.1","1.0",0,8,-1);
  iVar213 = version_test_symmetrical_flags("1.1","1.0",0,8,1);
  iVar214 = version_test_symmetrical_flags("1.0","1.0",4,4,0);
  iVar215 = version_test_symmetrical_flags("1.0","1.0",8,8,0);
  iVar216 = version_test_symmetrical_flags("1.0","1.0",4,8,-1);
  iVar217 = version_test_symmetrical_flags("1.0","1.1",8,4,-1);
  iVar218 = version_test_symmetrical_flags("0","0.0",8,8,1);
  iVar219 = version_test_symmetrical_flags("0","0.0",4,4,-1);
  fprintf(_stderr,"\nTest group: uniform component splitting\n");
  iVar220 = version_test_symmetrical("1.0alpha1","1.0alpha1",0);
  iVar221 = version_test_symmetrical("1.0alpha1","1.0.alpha1",0);
  iVar222 = version_test_symmetrical("1.0alpha1","1.0alpha.1",0);
  iVar223 = version_test_symmetrical("1.0alpha1","1.0.alpha.1",0);
  iVar224 = version_test_symmetrical("1.0patch1","1.0patch1",0);
  iVar225 = version_test_symmetrical("1.0patch1","1.0.patch1",0);
  iVar226 = version_test_symmetrical("1.0patch1","1.0patch.1",0);
  iVar227 = version_test_symmetrical("1.0patch1","1.0.patch.1",0);
  uVar228 = iVar227 + iVar226 + iVar225 + iVar224 + iVar223 + iVar222 + iVar221 + iVar220 + iVar219 
                                                  + iVar218 + iVar217 + iVar216 + iVar215 + iVar214 
                                                  + iVar213 + iVar212 + iVar211 + iVar210 + iVar209 
                                                  + iVar208 + iVar207 + iVar206 + iVar205 + iVar204 
                                                  + iVar203 + iVar202 + iVar201 + iVar200 + iVar199 
                                                  + iVar198 + iVar197 + iVar196 + iVar195 + iVar194 
                                                  + iVar193 + iVar192 + iVar191 + iVar190 + iVar189 
                                                  + iVar188 + iVar187 + iVar186 + iVar185 + iVar184 
                                                  + iVar183 + iVar182 + iVar181 + iVar180 + iVar179 
                                                  + iVar178 + iVar177 + iVar176 + iVar175 + iVar174 
                                                  + iVar173 + iVar172 + iVar171 + iVar170 + iVar169 
                                                  + iVar168 + iVar167 + iVar166 + iVar165 + iVar164 
                                                  + iVar163 + iVar162 + iVar161 + iVar160 + iVar159 
                                                  + iVar158 + iVar157 + iVar156 + iVar155 + iVar154 
                                                  + iVar153 + iVar152 + iVar151 + iVar150 + iVar149 
                                                  + iVar148 + iVar147 + iVar146 + iVar145 + iVar144 
                                                  + iVar143 + iVar142 + iVar141 + iVar140 + iVar139 
                                                  + iVar138 + iVar137 + iVar136 + iVar135 + iVar134 
                                                  + iVar133 + iVar132 + iVar131 + iVar130 + iVar129 
                                                  + iVar128 + iVar127 + iVar126 + iVar125 + iVar124 
                                                  + iVar123 + iVar122 + iVar121 + iVar120 + iVar119 
                                                  + iVar118 + iVar117 + iVar116 + iVar115 + iVar114 
                                                  + iVar113 + iVar112 + iVar111 + iVar110 + iVar109 
                                                  + iVar108 + iVar107 + iVar106 + iVar105 + iVar104 
                                                  + iVar103 + iVar102 + iVar101 + iVar100 + iVar99 +
                                                                                            iVar98 +
                                                                                            iVar97 +
                                                                                            iVar96 +
                                                                                            iVar95 +
                                                                                            iVar94 +
                                                                                            iVar93 +
                                                                                            iVar92 +
                                                                                            iVar91 +
                                                                                            iVar90 +
                                                                                            iVar89 +
                                                                                            iVar88 +
                                                                                            iVar87 +
                                                                                            iVar86 +
                                                                                            iVar85 +
                                                                                            iVar84 +
                                                                                            iVar83 +
                                                                                            iVar82 +
                                                                                            iVar81 +
                                                                                            iVar80 +
                                                                                            iVar79 +
                                                                                            iVar78 +
                                                                                            iVar77 +
                                                                                            iVar76 +
                                                                                            iVar75 +
                                                                                            iVar74 +
                                                                                            iVar73 +
                                                                                            iVar72 +
                                                                                            iVar71 +
                                                                                            iVar70 +
                                                                                            iVar69 +
                                                                                            iVar68 +
                                                                                            iVar67 +
                                                                                            iVar66 +
                                                                                            iVar65 +
                                                                                            iVar64 +
                                                                                            iVar63 +
                                                                                            iVar62 +
                                                                                            iVar61 +
                                                                                            iVar60 +
                                                                                            iVar59 +
                                                                                            iVar58 +
                                                                                            iVar57 +
                                                                                            iVar56 +
                                                                                            iVar55 +
                                                                                            iVar54 +
                                                                                            iVar53 +
                                                                                            iVar52 +
                                                                                            iVar51 +
                                                                                            iVar50 +
                                                                                            iVar49 +
                                                                                            iVar48 +
                                                                                            iVar47 +
                                                                                            iVar46 +
                                                                                            iVar45 +
                                                                                            iVar44 +
                                                                                            iVar43 +
                                                                                            iVar42 +
                                                                                            iVar41 +
                                                                                            iVar40 +
                                                                                            iVar39 +
                                                                                            iVar38 +
                                                                                            iVar37 +
                                                                                            iVar36 +
                                                                                            iVar35 +
                                                                                            iVar34 +
                                                                                            iVar33 +
                                                                                            iVar32 +
                                                                                            iVar31 +
                                                                                            iVar30 +
                                                                                            iVar29 +
                                                                                            iVar28 +
                                                                                            iVar27 +
                                                                                            iVar26 +
                                                                                            iVar25 +
                                                                                            iVar24 +
                                                                                            iVar23 +
                                                                                            iVar22 +
                                                                                            iVar21 +
                                                                                            iVar20 +
                                                                                            iVar19 +
                                                                                            iVar18 +
                                                                                            iVar17 +
                                                                                            iVar16 +
                                                                                            iVar15 +
                                                                                            iVar14 +
                                                                                            iVar13 +
                                                                                            iVar12 +
                                                                                            iVar11 +
                                                                                            iVar10 +
                                                                                            iVar9 + 
                                                  iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + 
                                                  iVar2 + iVar1;
  if (uVar228 == 0) {
    fprintf(_stderr,"\nAll tests OK!\n");
  }
  else {
    fprintf(_stderr,"\n%d test(s) failed!\n",(ulong)uVar228);
  }
  local_c = (uint)(uVar228 != 0);
  return local_c;
}

Assistant:

int main() {
	int errors = 0;

	fprintf(stderr, "Test group: equality\n");
	errors += version_test_symmetrical("0", "0", 0);
	errors += version_test_symmetrical("0a", "0a", 0);
	errors += version_test_symmetrical("a", "a", 0);
	errors += version_test_symmetrical("a0", "a0", 0);
	errors += version_test_symmetrical("0a1", "0a1", 0);
	errors += version_test_symmetrical("0a1b2", "0a1b2", 0);
	errors += version_test_symmetrical("1alpha1", "1alpha1", 0);
	errors += version_test_symmetrical("foo", "foo", 0);
	errors += version_test_symmetrical("1.2.3", "1.2.3", 0);
	errors += version_test_symmetrical("hello.world", "hello.world", 0);

	fprintf(stderr, "\nTest group: different number of components\n");
	errors += version_test_symmetrical("1", "1.0", 0);
	errors += version_test_symmetrical("1", "1.0.0", 0);
	errors += version_test_symmetrical("1.0", "1.0.0", 0);
	errors += version_test_symmetrical("1.0", "1.0.0.0.0.0.0.0", 0);

	fprintf(stderr, "\nTest group: leading zeroes\n");
	errors += version_test_symmetrical("00100.00100", "100.100", 0);
	errors += version_test_symmetrical("0", "00000000000000000", 0);

	fprintf(stderr, "\nTest group: simple comparisons\n");
	errors += version_test_symmetrical("0.0.0", "0.0.1", -1);
	errors += version_test_symmetrical("0.0.1", "0.0.2", -1);
	errors += version_test_symmetrical("0.0.2", "0.0.10", -1);
	errors += version_test_symmetrical("0.0.2", "0.1.0", -1);
	errors += version_test_symmetrical("0.0.10", "0.1.0", -1);
	errors += version_test_symmetrical("0.1.0", "0.1.1", -1);
	errors += version_test_symmetrical("0.1.1", "1.0.0", -1);
	errors += version_test_symmetrical("1.0.0", "10.0.0", -1);
	errors += version_test_symmetrical("10.0.0", "100.0.0", -1);
	errors += version_test_symmetrical("10.10000.10000", "11.0.0", -1);

	fprintf(stderr, "\nTest group: long numbers\n");
	errors += version_test_symmetrical("20160101", "20160102", -1);
	errors += version_test_symmetrical("999999999999999999", "1000000000000000000", -1);

	fprintf(stderr, "\nTest group: very long numbers\n");
	errors += version_test_symmetrical("99999999999999999999999999999999999998", "99999999999999999999999999999999999999", -1);

	fprintf(stderr, "\nTest group: letter addendum\n");
	errors += version_test_symmetrical("1.0", "1.0a", -1);
	errors += version_test_symmetrical("1.0a", "1.0b", -1);
	errors += version_test_symmetrical("1.0b", "1.1", -1);

	fprintf(stderr, "\nTest group: letter vs. number\n");
	errors += version_test_symmetrical("a", "0", -1);
	errors += version_test_symmetrical("1.a", "1.0", -1);

	fprintf(stderr, "\nTest group: letter-only component\n");
	errors += version_test_symmetrical("1.0.a", "1.0.b", -1);
	errors += version_test_symmetrical("1.0.b", "1.0.c", -1);
	errors += version_test_symmetrical("1.0.c", "1.0", -1);
	errors += version_test_symmetrical("1.0.c", "1.0.0", -1);

	fprintf(stderr, "\nTest group: letter component split\n");
	errors += version_test_symmetrical("1.0a0", "1.0.a0", 0);
	errors += version_test_symmetrical("1.0beta3", "1.0.b3", 0);

	fprintf(stderr, "\nTest group: case is ignored\n");
	errors += version_test_symmetrical("a", "A", 0);
	errors += version_test_symmetrical("1alpha", "1ALPHA", 0);
	errors += version_test_symmetrical("alpha1", "ALPHA1", 0);

	fprintf(stderr, "\nTest group: strings are shortened to one letter\n");
	errors += version_test_symmetrical("a", "alpha", 0);
	errors += version_test_symmetrical("b", "beta", 0);
	errors += version_test_symmetrical("p", "prerelease", 0);

	fprintf(stderr, "\nTest group: unusial component separators\n");
	errors += version_test_symmetrical("1.0.alpha.2", "1_0_alpha_2", 0);
	errors += version_test_symmetrical("1.0.alpha.2", "1-0-alpha-2", 0);
	errors += version_test_symmetrical("1.0.alpha.2", "1,0:alpha~2", 0);

	fprintf(stderr, "\nTest group: multiple consequentional separators\n");
	errors += version_test_symmetrical("..1....2....3..", "1.2.3", 0);
	errors += version_test_symmetrical(".-~1~-.-~2~-.", "1.2", 0);
	errors += version_test_symmetrical(".,:;~+-_", "0", 0);

	fprintf(stderr, "\nTest group: empty string\n");
	errors += version_test_symmetrical("", "", 0);
	errors += version_test_symmetrical("", "0", 0);
	errors += version_test_symmetrical("", "1", -1);

	fprintf(stderr, "\nTest group: prerelease sequence\n");
	/* XXX: is rc/pre ordering defined? */
	errors += version_test_symmetrical("1.0alpha1", "1.0alpha2", -1);
	errors += version_test_symmetrical("1.0alpha2", "1.0beta1", -1);
	errors += version_test_symmetrical("1.0beta1", "1.0beta2", -1);
	errors += version_test_symmetrical("1.0beta2", "1.0rc1", -1);
	errors += version_test_symmetrical("1.0beta2", "1.0pre1", -1);
	errors += version_test_symmetrical("1.0rc1", "1.0", -1);
	errors += version_test_symmetrical("1.0pre1", "1.0", -1);

	errors += version_test_symmetrical("1.0.alpha1", "1.0.alpha2", -1);
	errors += version_test_symmetrical("1.0.alpha2", "1.0.beta1", -1);
	errors += version_test_symmetrical("1.0.beta1", "1.0.beta2", -1);
	errors += version_test_symmetrical("1.0.beta2", "1.0.rc1", -1);
	errors += version_test_symmetrical("1.0.beta2", "1.0.pre1", -1);
	errors += version_test_symmetrical("1.0.rc1", "1.0", -1);
	errors += version_test_symmetrical("1.0.pre1", "1.0", -1);

	errors += version_test_symmetrical("1.0alpha.1", "1.0alpha.2", -1);
	errors += version_test_symmetrical("1.0alpha.2", "1.0beta.1", -1);
	errors += version_test_symmetrical("1.0beta.1", "1.0beta.2", -1);
	errors += version_test_symmetrical("1.0beta.2", "1.0rc.1", -1);
	errors += version_test_symmetrical("1.0beta.2", "1.0pre.1", -1);
	errors += version_test_symmetrical("1.0rc.1", "1.0", -1);
	errors += version_test_symmetrical("1.0pre.1", "1.0", -1);

	errors += version_test_symmetrical("1.0.alpha.1", "1.0.alpha.2", -1);
	errors += version_test_symmetrical("1.0.alpha.2", "1.0.beta.1", -1);
	errors += version_test_symmetrical("1.0.beta.1", "1.0.beta.2", -1);
	errors += version_test_symmetrical("1.0.beta.2", "1.0.rc.1", -1);
	errors += version_test_symmetrical("1.0.beta.2", "1.0.pre.1", -1);
	errors += version_test_symmetrical("1.0.rc.1", "1.0", -1);
	errors += version_test_symmetrical("1.0.pre.1", "1.0", -1);

	fprintf(stderr, "\nTest group: long word awareness\n");
	/* this should not be treated as 1.0a-1 */
	errors += version_test_symmetrical("1.0alpha-1", "0.9", 1);
	errors += version_test_symmetrical("1.0alpha-1", "1.0", -1);
	errors += version_test_symmetrical("1.0alpha-1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0alpha-1", "1.1", -1);

	errors += version_test_symmetrical("1.0beta-1", "0.9", 1);
	errors += version_test_symmetrical("1.0beta-1", "1.0", -1);
	errors += version_test_symmetrical("1.0beta-1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0beta-1", "1.1", -1);

	errors += version_test_symmetrical("1.0pre-1", "0.9", 1);
	errors += version_test_symmetrical("1.0pre-1", "1.0", -1);
	errors += version_test_symmetrical("1.0pre-1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0pre-1", "1.1", -1);

	errors += version_test_symmetrical("1.0prerelease-1", "0.9", 1);
	errors += version_test_symmetrical("1.0prerelease-1", "1.0", -1);
	errors += version_test_symmetrical("1.0prerelease-1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0prerelease-1", "1.1", -1);

	errors += version_test_symmetrical("1.0rc-1", "0.9", 1);
	errors += version_test_symmetrical("1.0rc-1", "1.0", -1);
	errors += version_test_symmetrical("1.0rc-1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0rc-1", "1.1", -1);

	fprintf(stderr, "\nTest group: post-release keyword awareness\n");
	/* this should not be treated as 1.0a-1 */
	errors += version_test_symmetrical("1.0patch1", "0.9", 1);
	errors += version_test_symmetrical("1.0patch1", "1.0", 1);
	errors += version_test_symmetrical("1.0patch1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0patch1", "1.1", -1);

	errors += version_test_symmetrical("1.0.patch1", "0.9", 1);
	errors += version_test_symmetrical("1.0.patch1", "1.0", 1);
	errors += version_test_symmetrical("1.0.patch1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0.patch1", "1.1", -1);

	errors += version_test_symmetrical("1.0patch.1", "0.9", 1);
	errors += version_test_symmetrical("1.0patch.1", "1.0", 1);
	errors += version_test_symmetrical("1.0patch.1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0patch.1", "1.1", -1);

	errors += version_test_symmetrical("1.0.patch.1", "0.9", 1);
	errors += version_test_symmetrical("1.0.patch.1", "1.0", 1);
	errors += version_test_symmetrical("1.0.patch.1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0.patch.1", "1.1", -1);

	errors += version_test_symmetrical("1.0post1", "0.9", 1);
	errors += version_test_symmetrical("1.0post1", "1.0", 1);
	errors += version_test_symmetrical("1.0post1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0post1", "1.1", -1);

	errors += version_test_symmetrical("1.0postanythinggoeshere1", "0.9", 1);
	errors += version_test_symmetrical("1.0postanythinggoeshere1", "1.0", 1);
	errors += version_test_symmetrical("1.0postanythinggoeshere1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0postanythinggoeshere1", "1.1", -1);

	errors += version_test_symmetrical("1.0pl1", "0.9", 1);
	errors += version_test_symmetrical("1.0pl1", "1.0", 1);
	errors += version_test_symmetrical("1.0pl1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0pl1", "1.1", -1);

	errors += version_test_symmetrical("1.0errata1", "0.9", 1);
	errors += version_test_symmetrical("1.0errata1", "1.0", 1);
	errors += version_test_symmetrical("1.0errata1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0errata1", "1.1", -1);

	fprintf(stderr, "\nTest group: p is patch flag\n");
	errors += version_test_symmetrical_flags("1.0p1", "1.0p1", 0, 0, 0);
	errors += version_test_symmetrical_flags("1.0p1", "1.0p1", VERSIONFLAG_P_IS_PATCH, VERSIONFLAG_P_IS_PATCH, 0);
	errors += version_test_symmetrical_flags("1.0p1", "1.0p1", VERSIONFLAG_P_IS_PATCH, 0, 1);
	errors += version_test_symmetrical_flags("1.0p1", "1.0p1", 0, VERSIONFLAG_P_IS_PATCH, -1);

	errors += version_test_symmetrical_flags("1.0p1", "1.0P1", 0, 0, 0);
	errors += version_test_symmetrical_flags("1.0p1", "1.0P1", VERSIONFLAG_P_IS_PATCH, VERSIONFLAG_P_IS_PATCH, 0);

	errors += version_test_symmetrical_flags("1.0", "1.0p1", 0, 0, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0p1", VERSIONFLAG_P_IS_PATCH, 0, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0p1", 0, VERSIONFLAG_P_IS_PATCH, -1);

	errors += version_test_symmetrical_flags("1.0", "1.0.p1", 0, 0, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0.p1", VERSIONFLAG_P_IS_PATCH, 0, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0.p1", 0, VERSIONFLAG_P_IS_PATCH, -1);

	errors += version_test_symmetrical_flags("1.0", "1.0.p.1", 0, 0, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0.p.1", VERSIONFLAG_P_IS_PATCH, 0, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0.p.1", 0, VERSIONFLAG_P_IS_PATCH, -1);

	/* this case is not affected */
	errors += version_test_symmetrical_flags("1.0", "1.0p.1", 0, 0, -1);
	errors += version_test_symmetrical_flags("1.0", "1.0p.1", VERSIONFLAG_P_IS_PATCH, 0, -1);
	errors += version_test_symmetrical_flags("1.0", "1.0p.1", 0, VERSIONFLAG_P_IS_PATCH, -1);

	fprintf(stderr, "\nTest group: any is patch flag\n");
	errors += version_test_symmetrical_flags("1.0a1", "1.0a1", 0, 0, 0);
	errors += version_test_symmetrical_flags("1.0a1", "1.0a1", VERSIONFLAG_ANY_IS_PATCH, VERSIONFLAG_ANY_IS_PATCH, 0);
	errors += version_test_symmetrical_flags("1.0a1", "1.0a1", VERSIONFLAG_ANY_IS_PATCH, 0, 1);
	errors += version_test_symmetrical_flags("1.0a1", "1.0a1", 0, VERSIONFLAG_ANY_IS_PATCH, -1);

	errors += version_test_symmetrical_flags("1.0", "1.0a1", 0, 0, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0a1", VERSIONFLAG_ANY_IS_PATCH, 0, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0a1", 0, VERSIONFLAG_ANY_IS_PATCH, -1);

	errors += version_test_symmetrical_flags("1.0", "1.0.a1", 0, 0, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0.a1", VERSIONFLAG_ANY_IS_PATCH, 0, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0.a1", 0, VERSIONFLAG_ANY_IS_PATCH, -1);

	errors += version_test_symmetrical_flags("1.0", "1.0.a.1", 0, 0, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0.a.1", VERSIONFLAG_ANY_IS_PATCH, 0, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0.a.1", 0, VERSIONFLAG_ANY_IS_PATCH, -1);

	/* this case is not affected */
	errors += version_test_symmetrical_flags("1.0", "1.0a.1", 0, 0, -1);
	errors += version_test_symmetrical_flags("1.0", "1.0a.1", VERSIONFLAG_ANY_IS_PATCH, 0, -1);
	errors += version_test_symmetrical_flags("1.0", "1.0a.1", 0, VERSIONFLAG_ANY_IS_PATCH, -1);

	fprintf(stderr, "\nTest group: p/patch compatibility\n");
	errors += version_test_symmetrical_flags("1.0p1", "1.0pre1", 0, 0, 0);
	errors += version_test_symmetrical_flags("1.0p1", "1.0patch1", 0, 0, -1);
	errors += version_test_symmetrical_flags("1.0p1", "1.0post1", 0, 0, -1);

	errors += version_test_symmetrical_flags("1.0p1", "1.0pre1", VERSIONFLAG_P_IS_PATCH, VERSIONFLAG_P_IS_PATCH, 1);
	errors += version_test_symmetrical_flags("1.0p1", "1.0patch1", VERSIONFLAG_P_IS_PATCH, VERSIONFLAG_P_IS_PATCH, 0);
	errors += version_test_symmetrical_flags("1.0p1", "1.0post1", VERSIONFLAG_P_IS_PATCH, VERSIONFLAG_P_IS_PATCH, 0);

	fprintf(stderr, "\nTest group: prerelease words without numbers\n");
	errors += version_test_symmetrical("1.0alpha", "1.0", -1);
	errors += version_test_symmetrical("1.0.alpha", "1.0", -1);

	errors += version_test_symmetrical("1.0beta", "1.0", -1);
	errors += version_test_symmetrical("1.0.beta", "1.0", -1);

	errors += version_test_symmetrical("1.0rc", "1.0", -1);
	errors += version_test_symmetrical("1.0.rc", "1.0", -1);

	errors += version_test_symmetrical("1.0pre", "1.0", -1);
	errors += version_test_symmetrical("1.0.pre", "1.0", -1);

	errors += version_test_symmetrical("1.0prerelese", "1.0", -1);
	errors += version_test_symmetrical("1.0.prerelese", "1.0", -1);

	errors += version_test_symmetrical("1.0patch", "1.0", 1);
	errors += version_test_symmetrical("1.0.patch", "1.0", 1);

	fprintf(stderr, "\nTest group: release bounds\n");
	errors += version_test_symmetrical_flags("0.99999", "1.0", 0, 0, -1);
	errors += version_test_symmetrical_flags("1.0alpha", "1.0", 0, 0, -1);
	errors += version_test_symmetrical_flags("1.0alpha0", "1.0", 0, 0, -1);
	errors += version_test_symmetrical_flags("1.0", "1.0", 0, 0, 0);
	errors += version_test_symmetrical_flags("1.0patch", "1.0", 0, 0, 1);
	errors += version_test_symmetrical_flags("1.0patch0", "1.0", 0, 0, 1);
	errors += version_test_symmetrical_flags("1.0.1", "1.0", 0, 0, 1);
	errors += version_test_symmetrical_flags("1.1", "1.0", 0, 0, 1);

	errors += version_test_symmetrical_flags("0.99999", "1.0", 0, VERSIONFLAG_LOWER_BOUND, -1);
	errors += version_test_symmetrical_flags("1.0alpha", "1.0", 0, VERSIONFLAG_LOWER_BOUND, 1);
	errors += version_test_symmetrical_flags("1.0alpha0", "1.0", 0, VERSIONFLAG_LOWER_BOUND, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0", 0, VERSIONFLAG_LOWER_BOUND, 1);
	errors += version_test_symmetrical_flags("1.0patch", "1.0", 0, VERSIONFLAG_LOWER_BOUND, 1);
	errors += version_test_symmetrical_flags("1.0patch0", "1.0", 0, VERSIONFLAG_LOWER_BOUND, 1);
	errors += version_test_symmetrical_flags("1.0a", "1.0", 0, VERSIONFLAG_LOWER_BOUND, 1);
	errors += version_test_symmetrical_flags("1.0.1", "1.0", 0, VERSIONFLAG_LOWER_BOUND, 1);
	errors += version_test_symmetrical_flags("1.1", "1.0", 0, VERSIONFLAG_LOWER_BOUND, 1);

	errors += version_test_symmetrical_flags("0.99999", "1.0", 0, VERSIONFLAG_UPPER_BOUND, -1);
	errors += version_test_symmetrical_flags("1.0alpha", "1.0", 0, VERSIONFLAG_UPPER_BOUND, -1);
	errors += version_test_symmetrical_flags("1.0alpha0", "1.0", 0, VERSIONFLAG_UPPER_BOUND, -1);
	errors += version_test_symmetrical_flags("1.0", "1.0", 0, VERSIONFLAG_UPPER_BOUND, -1);
	errors += version_test_symmetrical_flags("1.0patch", "1.0", 0, VERSIONFLAG_UPPER_BOUND, -1);
	errors += version_test_symmetrical_flags("1.0patch0", "1.0", 0, VERSIONFLAG_UPPER_BOUND, -1);
	errors += version_test_symmetrical_flags("1.0a", "1.0", 0, VERSIONFLAG_UPPER_BOUND, -1);
	errors += version_test_symmetrical_flags("1.0.1", "1.0", 0, VERSIONFLAG_UPPER_BOUND, -1);
	errors += version_test_symmetrical_flags("1.1", "1.0", 0, VERSIONFLAG_UPPER_BOUND, 1);

	errors += version_test_symmetrical_flags("1.0", "1.0", VERSIONFLAG_LOWER_BOUND, VERSIONFLAG_LOWER_BOUND, 0);
	errors += version_test_symmetrical_flags("1.0", "1.0", VERSIONFLAG_UPPER_BOUND, VERSIONFLAG_UPPER_BOUND, 0);
	errors += version_test_symmetrical_flags("1.0", "1.0", VERSIONFLAG_LOWER_BOUND, VERSIONFLAG_UPPER_BOUND, -1);

	errors += version_test_symmetrical_flags("1.0", "1.1", VERSIONFLAG_UPPER_BOUND, VERSIONFLAG_LOWER_BOUND, -1);

	errors += version_test_symmetrical_flags("0", "0.0", VERSIONFLAG_UPPER_BOUND, VERSIONFLAG_UPPER_BOUND, 1);
	errors += version_test_symmetrical_flags("0", "0.0", VERSIONFLAG_LOWER_BOUND, VERSIONFLAG_LOWER_BOUND, -1);

	fprintf(stderr, "\nTest group: uniform component splitting\n");
	errors += version_test_symmetrical("1.0alpha1", "1.0alpha1", 0);
	errors += version_test_symmetrical("1.0alpha1", "1.0.alpha1", 0);
	errors += version_test_symmetrical("1.0alpha1", "1.0alpha.1", 0);
	errors += version_test_symmetrical("1.0alpha1", "1.0.alpha.1", 0);

	errors += version_test_symmetrical("1.0patch1", "1.0patch1", 0);
	errors += version_test_symmetrical("1.0patch1", "1.0.patch1", 0);
	errors += version_test_symmetrical("1.0patch1", "1.0patch.1", 0);
	errors += version_test_symmetrical("1.0patch1", "1.0.patch.1", 0);

	/* controversial - TBD
	fprintf(stderr, "\nTest group: letter vs. numeric component ordering\n");
	errors += version_test_symmetrical("1.0", "1.0a", -1);
	errors += version_test_symmetrical("1.0a", "1.0.1", -1);
	*/

	if (errors) {
		fprintf(stderr, "\n%d test(s) failed!\n", errors);
		return 1;
	}

	fprintf(stderr, "\nAll tests OK!\n");
	return 0;
}